

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.hpp
# Opt level: O3

void boost::runtime::env::env_detail::
     fetch_absent<std::pair<boost::unit_test::basic_cstring<char_const>,bool>(*)(boost::unit_test::basic_cstring<char_const>)>
               (parameters_store *params,arguments_store *args,
               _func_pair<boost::unit_test::basic_cstring<const_char>,_bool>_basic_cstring<const_char>
               *read_func)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  iterator extraout_RDX;
  _Rb_tree_header *p_Var4;
  basic_cstring<const_char> bVar5;
  basic_param_ptr param;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> value;
  shared_count local_160;
  iterator local_158;
  iterator local_150;
  _Base_ptr local_148;
  long local_140;
  key_type local_138;
  pair<boost::unit_test::basic_cstring<const_char>,_bool> local_128;
  undefined **local_110;
  _Base_ptr local_108;
  iterator local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  format_error local_d8;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> local_a0;
  format_error local_68;
  
  p_Var3 = (params->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(params->m_parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      p_Var1 = p_Var3[1]._M_left;
      local_160.pi_ = (sp_counted_base *)p_Var3[1]._M_right;
      if ((_Base_ptr)local_160.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_160.pi_)->_M_parent =
             *(int *)&((_Base_ptr)local_160.pi_)->_M_parent + 1;
        UNLOCK();
      }
      if (p_Var1 == (_Base_ptr)0x0) goto LAB_0019065d;
      local_138.m_begin = (iterator)p_Var1->_M_parent;
      local_138.m_end =
           (iterator)((long)&((_Base_ptr)local_138.m_begin)->_M_color + (long)p_Var1->_M_left);
      cVar2 = std::
              _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
              ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                      *)args,&local_138);
      if ((_Rb_tree_header *)cVar2._M_node ==
          &(args->m_arguments)._M_t._M_impl.super__Rb_tree_header) {
        if (p_Var1 == (_Base_ptr)0x0) goto LAB_0019065d;
        if (p_Var1[3]._M_left != (_Base_ptr)0x0) {
          local_148 = p_Var1[3]._M_parent;
          local_140 = (long)&(p_Var1[3]._M_left)->_M_color + (long)local_148;
          bVar5.m_end = extraout_RDX;
          bVar5.m_begin = (iterator)&local_148;
          (*read_func)(&local_128,bVar5);
          if (local_128.second != false) {
            if (local_128.first.m_end == local_128.first.m_begin) {
              if (p_Var1 == (_Base_ptr)0x0) {
LAB_0019065d:
                __assert_fail("px != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                              ,0x2de,
                              "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
                             );
              }
              if (*(char *)((long)&p_Var1[5]._M_parent + 2) == '\0') {
                local_108 = p_Var1->_M_parent;
                local_100 = (iterator)((long)&p_Var1->_M_left->_M_color + (long)local_108);
                local_f8._M_p = (pointer)&local_e8;
                local_f0 = 0;
                local_e8._M_local_buf[0] = '\0';
                local_110 = &PTR__param_error_001ca150;
                specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                operator<<(&local_d8,
                           (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                            *)&local_110,"Missing an argument value for the parameter ");
                if (p_Var1 != (_Base_ptr)0x0) {
                  specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                  operator<<((format_error *)&local_a0,
                             (specific_param_error<boost::runtime::format_error,boost::runtime::input_error>
                              *)&local_d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_Var1->_M_parent);
                  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
                  operator<<(&local_68,&local_a0," in the environment.");
                  unit_test::ut_detail::throw_exception<boost::runtime::format_error>(&local_68);
                }
                goto LAB_0019065d;
              }
            }
            else if (p_Var1 == (_Base_ptr)0x0) goto LAB_0019065d;
            local_158 = local_128.first.m_begin;
            local_150 = local_128.first.m_end;
            (**(code **)(*(long *)p_Var1 + 0x18))(p_Var1,&local_158,0,args);
          }
        }
      }
      detail::shared_count::~shared_count(&local_160);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

inline void
fetch_absent( parameters_store const& params, runtime::arguments_store& args, ReadFunc read_func )
{
    BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, params.all() ) {
        basic_param_ptr param = v.second;

        if( args.has( param->p_name ) || param->p_env_var.empty() )
            continue;

        std::pair<cstring,bool> value = read_func( param->p_env_var );

        if( !value.second )
            continue;

        // Validate against unexpected empty value
        BOOST_TEST_I_ASSRT( !value.first.is_empty() || param->p_has_optional_value,
            format_error( param->p_name ) 
                << "Missing an argument value for the parameter " << param->p_name
                << " in the environment." );

        // Produce argument value
        param->produce_argument( value.first, false, args );

    }
}